

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_sig.c
# Opt level: O2

err_t cmdSigPrintCertc(cmd_sig_t *sig)

{
  size_t sVar1;
  uint uVar2;
  octet *der;
  size_t count;
  
  count = sig->certs_len;
  der = sig->certs;
  uVar2 = 0;
  while( true ) {
    if (count == 0) {
      printf("%u",(ulong)uVar2);
      return 0;
    }
    sVar1 = btokCVCLen(der,count);
    if (sVar1 == 0xffffffffffffffff) break;
    count = count - sVar1;
    der = der + sVar1;
    uVar2 = uVar2 + 1;
  }
  return 0x202;
}

Assistant:

static err_t cmdSigPrintCertc(const cmd_sig_t* sig)
{
	size_t certs_len;
	const octet* cert;
	size_t cert_len;
	size_t count;
	// определить число сертификатов
	certs_len = sig->certs_len, cert = sig->certs, count = 0;
	while (certs_len)
	{
		cert_len = btokCVCLen(cert, certs_len);
		if (cert_len == SIZE_MAX)
			return ERR_BAD_CERT;
		certs_len -= cert_len, cert += cert_len, ++count;
	}
	// печатать число сертификатов
	printf("%u", (unsigned)count);
	return ERR_OK;
}